

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O0

void COLLADABU::Math::Quaternion::intermediate
               (Quaternion *rkQ0,Quaternion *rkQ1,Quaternion *rkQ2,Quaternion *rkA,Quaternion *rkB)

{
  Quaternion *in_RCX;
  Quaternion *in_RSI;
  Quaternion *in_R8;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  Quaternion kMinusArg;
  Quaternion kArg;
  Quaternion rkP1;
  Quaternion rkP0;
  Quaternion kQ1inv;
  Quaternion kQ0inv;
  Quaternion *in_stack_fffffffffffffe28;
  Quaternion *in_stack_fffffffffffffe30;
  Quaternion *in_stack_fffffffffffffe38;
  Quaternion local_1a8;
  Quaternion local_188;
  Quaternion local_168 [2];
  Quaternion local_128;
  Quaternion local_108 [7];
  Quaternion *local_28;
  Quaternion *local_20;
  Quaternion *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  unitInverse(in_stack_fffffffffffffe28);
  unitInverse(in_stack_fffffffffffffe28);
  operator*(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  operator*(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  __x_00 = log(local_108,__x);
  log(&local_128,__x_00);
  operator-(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Math::operator*((Real)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  operator-(in_stack_fffffffffffffe28);
  exp(&local_188,__x_01);
  operator*(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  operator=(local_20,local_168);
  exp((Quaternion *)&stack0xfffffffffffffe38,__x_02);
  operator*(in_stack_fffffffffffffe38,local_10);
  operator=(local_28,&local_1a8);
  return;
}

Assistant:

void Quaternion::intermediate ( const Quaternion& rkQ0,
                                        const Quaternion& rkQ1, const Quaternion& rkQ2,
                                        Quaternion& rkA, Quaternion& rkB )
        {
            // assert:  q0, q1, q2 are unit quaternions

            Quaternion kQ0inv = rkQ0.unitInverse();
            Quaternion kQ1inv = rkQ1.unitInverse();
            Quaternion rkP0 = kQ0inv * rkQ1;
            Quaternion rkP1 = kQ1inv * rkQ2;
            Quaternion kArg = 0.25 * ( rkP0.log() - rkP1.log() );
            Quaternion kMinusArg = -kArg;

            rkA = rkQ1 * kArg.exp();
            rkB = rkQ1 * kMinusArg.exp();
        }